

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.cpp
# Opt level: O3

void __thiscall QTextFormat::setObjectIndex(QTextFormat *this,int o)

{
  Property *__src;
  Property *pPVar1;
  Data *pDVar2;
  Property *pPVar3;
  QTextFormatPrivate *pQVar4;
  long lVar5;
  QArrayDataPointer<(anonymous_namespace)::Property> *in_RCX;
  long lVar6;
  Property *pPVar7;
  QTextFormatPrivate *this_00;
  Property *__dest;
  long in_FS_OFFSET;
  QVariant QStack_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (this->d).d.ptr;
  if (o == -1) {
    if (pQVar4 != (QTextFormatPrivate *)0x0) {
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextFormatPrivate>::detach_helper(&this->d);
        pQVar4 = (this->d).d.ptr;
      }
      lVar5 = (pQVar4->props).d.size;
      if (lVar5 != 0) {
        pPVar7 = (pQVar4->props).d.ptr;
        lVar6 = 0x28;
        do {
          if (*(int *)((long)&pPVar7[-1].key + lVar6) == 0) {
            pQVar4->hashDirty = true;
            pDVar2 = (pQVar4->props).d.d;
            if ((pDVar2 == (Data *)0x0) ||
               (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QArrayDataPointer<(anonymous_namespace)::Property>::reallocateAndGrow
                        (&(pQVar4->props).d,GrowsAtEnd,0,in_RCX);
              pPVar7 = (pQVar4->props).d.ptr;
            }
            __src = (Property *)((long)&pPVar7->key + lVar6);
            __dest = (Property *)((long)&pPVar7[-1].key + lVar6);
            ::QVariant::~QVariant((QVariant *)((long)pPVar7 + lVar6 + -0x20));
            pPVar3 = (pQVar4->props).d.ptr;
            lVar5 = (pQVar4->props).d.size;
            pPVar1 = pPVar3 + lVar5;
            if ((__dest == pPVar3) && (__src != pPVar1)) {
              (pQVar4->props).d.ptr = __src;
            }
            else if (__src != pPVar1) {
              memmove(__dest,__src,(long)pPVar1 + (-lVar6 - (long)pPVar7));
              lVar5 = (pQVar4->props).d.size;
            }
            (pQVar4->props).d.size = lVar5 + -1;
            break;
          }
          lVar6 = lVar6 + 0x28;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
    }
    goto LAB_005087e3;
  }
  if (pQVar4 == (QTextFormatPrivate *)0x0) {
    pQVar4 = (QTextFormatPrivate *)operator_new(0x40);
    (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i = 0;
    (pQVar4->props).d.d = (Data *)0x0;
    (pQVar4->props).d.ptr = (Property *)0x0;
    this_00 = (QTextFormatPrivate *)0x0;
    (pQVar4->props).d.size = 0;
    pQVar4->hashDirty = true;
    pQVar4->fontDirty = true;
    pQVar4->hashValue = 0;
    QFont::QFont(&pQVar4->fnt);
    QSharedDataPointer<QTextFormatPrivate>::reset(&this->d,pQVar4);
    pQVar4 = (this->d).d.ptr;
    if (pQVar4 != (QTextFormatPrivate *)0x0) goto LAB_005087ab;
  }
  else {
LAB_005087ab:
    this_00 = pQVar4;
    if ((this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      QSharedDataPointer<QTextFormatPrivate>::detach_helper(&this->d);
      this_00 = (this->d).d.ptr;
    }
  }
  ::QVariant::QVariant(&QStack_58,o);
  QTextFormatPrivate::insertProperty(this_00,0,&QStack_58);
  ::QVariant::~QVariant(&QStack_58);
LAB_005087e3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextFormat::setObjectIndex(int o)
{
    if (o == -1) {
        if (d.constData())
            d->clearProperty(ObjectIndex);
    } else {
        if (!d.constData())
            d = new QTextFormatPrivate;
        // ### type
        d->insertProperty(ObjectIndex, o);
    }
}